

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O2

int mp_read_int32(char **data,int32_t *ret)

{
  char cVar1;
  uint uVar2;
  char *pcVar3;
  ulong uVar4;
  ulong uVar5;
  ulong *puVar6;
  
  pcVar3 = *data;
  cVar1 = *pcVar3;
  puVar6 = (ulong *)(pcVar3 + 1);
  switch(cVar1) {
  case -0x34:
    uVar5 = (ulong)(byte)pcVar3[1];
    goto LAB_00129ac4;
  case -0x33:
    puVar6 = (ulong *)(pcVar3 + 3);
    uVar5 = (ulong)(ushort)(*(ushort *)(pcVar3 + 1) << 8 | *(ushort *)(pcVar3 + 1) >> 8);
    break;
  case -0x32:
    uVar2 = *(uint *)(pcVar3 + 1);
    uVar5 = (ulong)(uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18)
    ;
    puVar6 = (ulong *)(pcVar3 + 5);
    goto LAB_00129ae0;
  case -0x31:
    uVar5 = *(ulong *)(pcVar3 + 1);
    uVar5 = uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 | (uVar5 & 0xff0000000000) >> 0x18 |
            (uVar5 & 0xff00000000) >> 8 | (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 |
            (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38;
    puVar6 = (ulong *)(pcVar3 + 9);
LAB_00129ae0:
    if (0x7fffffff < uVar5) {
      return -1;
    }
    break;
  case -0x30:
    uVar5 = (ulong)(uint)(int)pcVar3[1];
LAB_00129ac4:
    puVar6 = (ulong *)(pcVar3 + 2);
    break;
  case -0x2f:
    puVar6 = (ulong *)(pcVar3 + 3);
    uVar5 = (ulong)(uint)(int)(short)(*(ushort *)(pcVar3 + 1) << 8 | *(ushort *)(pcVar3 + 1) >> 8);
    break;
  case -0x2e:
    uVar2 = *(uint *)(pcVar3 + 1);
    uVar5 = (ulong)(uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18)
    ;
    puVar6 = (ulong *)(pcVar3 + 5);
    break;
  case -0x2d:
    uVar5 = *puVar6;
    uVar4 = uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 | (uVar5 & 0xff0000000000) >> 0x18 |
            (uVar5 & 0xff00000000) >> 8;
    uVar5 = uVar4 | (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 |
            (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38;
    if ((long)(int)uVar4 != uVar5) {
      return -1;
    }
    puVar6 = (ulong *)(pcVar3 + 9);
    break;
  default:
    if (cVar1 < -0x20) {
      return -1;
    }
    uVar5 = (ulong)(uint)(int)cVar1;
  }
  *ret = (int32_t)uVar5;
  *data = (char *)puVar6;
  return 0;
}

Assistant:

MP_IMPL int
mp_read_int32(const char **data, int32_t *ret)
{
	int64_t ival;
	uint64_t uval;
	const char *p = *data;
	uint8_t c = mp_load_u8(&p);
	switch (c) {
	case 0xd0:
		*ret = (int8_t)mp_load_u8(&p);
		goto commit;
	case 0xd1:
		*ret = (int16_t)mp_load_u16(&p);
		goto commit;
	case 0xd2:
		*ret = (int32_t)mp_load_u32(&p);
		goto commit;
	case 0xd3:
		ival = (int64_t)mp_load_u64(&p);
		if (mp_unlikely(ival > INT32_MAX || ival < INT32_MIN))
			return -1;
		*ret = (int32_t)ival;
		goto commit;
	case 0xcc:
		*ret = (int32_t)mp_load_u8(&p);
		goto commit;
	case 0xcd:
		*ret = (int32_t)mp_load_u16(&p);
		goto commit;
	case 0xce:
		uval = mp_load_u32(&p);
		goto handle_unsigned;
	case 0xcf:
		uval = mp_load_u64(&p);
		goto handle_unsigned;
	default:
		if (mp_unlikely(c < 0xe0 && c > 0x7f))
			return -1;
		*ret = (int8_t) c;
		goto commit;
	}
handle_unsigned:
	if (mp_unlikely(uval > INT32_MAX))
		return -1;
	*ret = (int32_t)uval;
	goto commit;
commit:
	*data = p;
	return 0;
}